

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int FlushFrames(WebPAnimEncoder *enc)

{
  WebPAnimEncoder *in_RDI;
  WebPMuxFrameInfo *unaff_retaddr;
  WebPMux *in_stack_00000008;
  EncodedFrame temp;
  int enc_start_tmp;
  WebPMuxFrameInfo *info;
  EncodedFrame *curr;
  WebPMuxError err;
  char *in_stack_ffffffffffffff58;
  WebPAnimEncoder *enc_00;
  undefined1 local_98 [108];
  int local_2c;
  WebPAnimEncoder *local_28;
  WebPAnimEncoder *local_20;
  WebPMuxError local_14;
  WebPAnimEncoder *local_10;
  int in_stack_fffffffffffffffc;
  
  local_10 = in_RDI;
  while( true ) {
    if (local_10->flush_count_ == 0) {
      if ((local_10->count_ == 1) && (local_10->start_ != 0)) {
        local_2c = (int)local_10->start_;
        memcpy(local_98,local_10->encoded_frames_,0x68);
        memcpy(local_10->encoded_frames_,local_10->encoded_frames_ + local_2c,0x68);
        memcpy(local_10->encoded_frames_ + local_2c,local_98,0x68);
        FrameRelease((EncodedFrame *)0x1a0b77);
        local_10->start_ = 0;
      }
      return 1;
    }
    local_20 = (WebPAnimEncoder *)GetFrame(local_10,0);
    enc_00 = local_20;
    if ((local_20->last_config_).sns_strength != 0) {
      enc_00 = (WebPAnimEncoder *)((local_20->options_).padding + 3);
    }
    local_28 = enc_00;
    local_14 = WebPMuxPushFrame(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc);
    if (local_14 != WEBP_MUX_OK) break;
    if ((local_10->options_).verbose != 0) {
      fprintf(_stderr,"INFO: Added frame. offset:%d,%d dispose:%d blend:%d\n",
              (ulong)(uint)(local_28->options_).minimize_size,(ulong)(uint)(local_28->options_).kmin
              ,(ulong)(uint)(local_28->options_).verbose,(ulong)(local_28->options_).padding[0]);
    }
    local_10->out_frame_count_ = local_10->out_frame_count_ + 1;
    FrameRelease((EncodedFrame *)0x1a0a21);
    local_10->start_ = local_10->start_ + 1;
    local_10->flush_count_ = local_10->flush_count_ - 1;
    local_10->count_ = local_10->count_ - 1;
    if (local_10->keyframe_ != -1) {
      local_10->keyframe_ = local_10->keyframe_ + -1;
    }
  }
  MarkError2(enc_00,in_stack_ffffffffffffff58,0);
  return 0;
}

Assistant:

static int FlushFrames(WebPAnimEncoder* const enc) {
  while (enc->flush_count_ > 0) {
    WebPMuxError err;
    EncodedFrame* const curr = GetFrame(enc, 0);
    const WebPMuxFrameInfo* const info =
        curr->is_key_frame_ ? &curr->key_frame_ : &curr->sub_frame_;
    assert(enc->mux_ != NULL);
    err = WebPMuxPushFrame(enc->mux_, info, 1);
    if (err != WEBP_MUX_OK) {
      MarkError2(enc, "ERROR adding frame. WebPMuxError", err);
      return 0;
    }
    if (enc->options_.verbose) {
      fprintf(stderr, "INFO: Added frame. offset:%d,%d dispose:%d blend:%d\n",
              info->x_offset, info->y_offset, info->dispose_method,
              info->blend_method);
    }
    ++enc->out_frame_count_;
    FrameRelease(curr);
    ++enc->start_;
    --enc->flush_count_;
    --enc->count_;
    if (enc->keyframe_ != KEYFRAME_NONE) --enc->keyframe_;
  }

  if (enc->count_ == 1 && enc->start_ != 0) {
    // Move enc->start to index 0.
    const int enc_start_tmp = (int)enc->start_;
    EncodedFrame temp = enc->encoded_frames_[0];
    enc->encoded_frames_[0] = enc->encoded_frames_[enc_start_tmp];
    enc->encoded_frames_[enc_start_tmp] = temp;
    FrameRelease(&enc->encoded_frames_[enc_start_tmp]);
    enc->start_ = 0;
  }
  return 1;
}